

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O2

void run_kd_tree<std::array<float,784ul>,float>
               (vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *train,
               vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *test,
               string *fn_nns_gt,max_leaf_size_t tree_max_leaf_size,
               vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
               *nns)

{
  pointer pnVar1;
  bool bVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  long lVar6;
  allocator<char> local_1961;
  string *local_1960;
  max_leaf_size_t tree_max_leaf_size_local;
  string local_1950;
  scoped_timer t1;
  kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  kd_tree;
  
  tree_max_leaf_size_local = tree_max_leaf_size;
  pico_tree::std::
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::resize
            (nns,((long)(test->
                        super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(test->
                       super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0xc40);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&kd_tree,fn_nns_gt,auto_format);
  bVar2 = pico_tree::std::filesystem::exists((path *)&kd_tree);
  pico_tree::std::filesystem::__cxx11::path::~path((path *)&kd_tree);
  if (bVar2) {
    pico_tree::read_bin<pico_tree::neighbor<int,float>>(fn_nns_gt,nns);
    poVar3 = std::operator<<((ostream *)&std::cout,"kd_tree not created. Read ");
    poVar3 = std::operator<<(poVar3,(string *)fn_nns_gt);
    poVar3 = std::operator<<(poVar3," instead.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Creating ");
    poVar3 = std::operator<<(poVar3,(string *)fn_nns_gt);
    poVar3 = std::operator<<(poVar3," using the kd_tree. Be *very* patient.");
    std::endl<char,std::char_traits<char>>(poVar3);
    t1.name_._M_string_length = (size_type)&tree_max_leaf_size_local;
    t1.name_._M_dataplus._M_p = (pointer)train;
    run_kd_tree<std::array<float,_784UL>,_float>::anon_class_16_2_5d62e1b5::operator()
              (&kd_tree,(anon_class_16_2_5d62e1b5 *)&t1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1950,"kd_tree query",&local_1961);
    local_1960 = fn_nns_gt;
    pico_tree::scoped_timer::scoped_timer(&t1,&local_1950);
    std::__cxx11::string::~string((string *)&local_1950);
    lVar6 = 0;
    lVar5 = 0;
    for (uVar4 = 0;
        pnVar1 = (nns->
                 super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(nns->
                              super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar1 >> 3);
        uVar4 = uVar4 + 1) {
      pico_tree::
      kd_tree<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
      ::search_nn<std::array<float,784ul>>
                ((kd_tree<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
                  *)&kd_tree,
                 (array<float,_784UL> *)
                 ((long)((test->
                         super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6),
                 (neighbor_type *)((long)&pnVar1->index + lVar5));
      lVar5 = lVar5 + 8;
      lVar6 = lVar6 + 0xc40;
    }
    pico_tree::scoped_timer::~scoped_timer(&t1);
    pico_tree::write_bin<pico_tree::neighbor<int,float>>(local_1960,nns);
    pico_tree::internal::
    kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_784UL>::~kd_tree_data
              (&kd_tree.data_);
  }
  return;
}

Assistant:

void run_kd_tree(
    std::vector<Vector_> const& train,
    std::vector<Vector_> const& test,
    std::string const& fn_nns_gt,
    pico_tree::max_leaf_size_t tree_max_leaf_size,
    std::vector<pico_tree::neighbor<int, Scalar_>>& nns) {
  using space = std::reference_wrapper<std::vector<Vector_> const>;

  nns.resize(test.size());

  if (!std::filesystem::exists(fn_nns_gt)) {
    std::cout << "Creating " << fn_nns_gt
              << " using the kd_tree. Be *very* patient." << std::endl;

    auto kd_tree = [&train, &tree_max_leaf_size]() {
      pico_tree::scoped_timer t0("kd_tree build");
      return pico_tree::kd_tree<space>(train, tree_max_leaf_size);
    }();

    {
      pico_tree::scoped_timer t1("kd_tree query");
      for (std::size_t i = 0; i < nns.size(); ++i) {
        kd_tree.search_nn(test[i], nns[i]);
      }
    }

    pico_tree::write_bin(fn_nns_gt, nns);
  } else {
    pico_tree::read_bin(fn_nns_gt, nns);
    std::cout << "kd_tree not created. Read " << fn_nns_gt << " instead."
              << std::endl;
  }
}